

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O0

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::SetParentAttribute
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,PointAttribute *att)

{
  uint8_t uVar1;
  Type TVar2;
  GeometryAttribute *in_RSI;
  long in_RDI;
  undefined1 local_1;
  
  if (in_RSI == (GeometryAttribute *)0x0) {
    local_1 = false;
  }
  else {
    TVar2 = GeometryAttribute::attribute_type(in_RSI);
    if (TVar2 == POSITION) {
      uVar1 = GeometryAttribute::num_components(in_RSI);
      if (uVar1 == '\x03') {
        *(GeometryAttribute **)(in_RDI + 0x60) = in_RSI;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SetParentAttribute(const PointAttribute *att) override {
    if (att == nullptr) {
      return false;
    }
    if (att->attribute_type() != GeometryAttribute::POSITION) {
      return false;  // Invalid attribute type.
    }
    if (att->num_components() != 3) {
      return false;  // Currently works only for 3 component positions.
    }
    pos_attribute_ = att;
    return true;
  }